

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Layer::Layer(Layer *this)

{
  Layer *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  ::unordered_map(&this->_prim_specs);
  LayerMetas::LayerMetas(&this->_metas);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  ::map(&this->_primspec_path_cache);
  this->_dirty = true;
  this->_has_unresolved_references = true;
  this->_has_unresolved_payload = true;
  this->_has_unresolved_variant = true;
  this->_has_unresolved_inherits = true;
  this->_has_unresolved_specializes = true;
  this->_has_over_primspec = true;
  this->_has_class_primspec = true;
  ::std::__cxx11::string::string((string *)&this->_current_working_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_asset_search_paths);
  this->_asset_resolution_userdata = (void *)0x0;
  return;
}

Assistant:

const std::string name() const { return _name; }